

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_fft.cpp
# Opt level: O2

bool fft::RandomImageFFT(void)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t width;
  ulong uVar6;
  uchar *__s2;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  Image input;
  Image output;
  Image diracDelta;
  ComplexData complexDataDracDelta;
  ComplexData complexDataInput;
  FFTExecutor fftExecutor;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    if (uVar2 == 0x20) break;
    uVar3 = rand();
    width = 2 << uVar3 % 0xb;
    Unit_Test::randomImage(&input,width,width);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&diracDelta,input._width,input._height,'\x01','\x01');
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(&diracDelta,'\0');
    diracDelta._data[(diracDelta._width >> 1) + (diracDelta._height >> 1) * diracDelta._rowSize] =
         '\x01';
    FFT::ComplexData::ComplexData(&complexDataInput,&input);
    FFT::ComplexData::ComplexData(&complexDataDracDelta,&diracDelta);
    FFT::FFTExecutor::FFTExecutor(&fftExecutor,input._width,input._height);
    FFT::FFTExecutor::directTransform(&fftExecutor,&complexDataInput);
    FFT::FFTExecutor::directTransform(&fftExecutor,&complexDataDracDelta);
    FFT::FFTExecutor::complexMultiplication
              (&fftExecutor,&complexDataInput,&complexDataDracDelta,&complexDataInput);
    FFT::FFTExecutor::inverseTransform(&fftExecutor,&complexDataInput);
    FFT::ComplexData::get(&output,&complexDataInput);
    puVar1 = input._data;
    if (((input._height == output._height) && (input._width == output._width)) &&
       (input._colorCount == output._colorCount)) {
      uVar5 = (ulong)input._rowSize;
      uVar6 = (ulong)output._rowSize;
      uVar3 = input._width * input._colorCount;
      uVar7 = input._height * input._rowSize;
      __s2 = output._data;
      for (uVar8 = 0; bVar9 = uVar7 == uVar8, !bVar9; uVar8 = uVar8 + uVar5) {
        iVar4 = bcmp(puVar1 + uVar8,__s2,(ulong)uVar3);
        if (iVar4 != 0) break;
        __s2 = __s2 + uVar6;
      }
    }
    else {
      bVar9 = false;
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
    FFT::FFTExecutor::~FFTExecutor(&fftExecutor);
    FFT::ComplexData::~ComplexData(&complexDataDracDelta);
    FFT::ComplexData::~ComplexData(&complexDataInput);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&diracDelta);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
    uVar3 = uVar2 + 1;
  } while (bVar9);
  return 0x1f < uVar2;
}

Assistant:

bool RandomImageFFT()
    {
        for ( uint32_t i = 0u; i < 32u; ++i ) { // a special case for FFT because it take a lot of time for execution
            const uint32_t dimension = (2u << Unit_Test::randomValue<uint8_t>( 11 ));

            const PenguinV_Image::Image input = Unit_Test::randomImage( dimension, dimension );

            PenguinV_Image::Image diracDelta( input.width(), input.height() );
            diracDelta.fill( 0u );
            diracDelta.data()[diracDelta.height() / 2 * diracDelta.rowSize() + diracDelta.width() / 2 ] = 1u;

            FFT::ComplexData complexDataInput( input );
            FFT::ComplexData complexDataDracDelta( diracDelta );

            FFT::FFTExecutor fftExecutor( input.width(), input.height() );

            fftExecutor.directTransform( complexDataInput );
            fftExecutor.directTransform( complexDataDracDelta );
            fftExecutor.complexMultiplication( complexDataInput, complexDataDracDelta, complexDataInput );
            fftExecutor.inverseTransform( complexDataInput );

            const PenguinV_Image::Image output = complexDataInput.get();

            if( input.height() != output.height() || input.width() != output.width() || input.colorCount() != output.colorCount() )
                return false;

            const uint32_t rowSizeIn  = input.rowSize();
            const uint32_t rowSizeOut = output.rowSize();
            const uint32_t width = input.width() * input.colorCount();
            const uint8_t * inY  = input.data();
            const uint8_t * outY = output.data();
            const uint8_t * inYEnd = inY + rowSizeIn * input.height();

            for ( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                if ( memcmp( inY, outY, width ) != 0 )
                    return false;
            }
        }
        return true;
    }